

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O0

LongBufferSizeType __thiscall
OutputAESEncodeStream::Write(OutputAESEncodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 *puVar4;
  size_t __n;
  LongBufferSizeType remainder;
  LongBufferSizeType left;
  undefined1 local_114 [8];
  PDFDate currentTime;
  MD5Generator md5;
  LongBufferSizeType inSize_local;
  Byte *inBuffer_local;
  OutputAESEncodeStream *this_local;
  
  if (this->mTargetStream == (IByteWriterWithPosition *)0x0) {
    this_local = (OutputAESEncodeStream *)0x0;
  }
  else {
    remainder = inSize;
    if ((this->mWroteIV & 1U) == 0) {
      MD5Generator::MD5Generator((MD5Generator *)&currentTime.HourFromUTC);
      PDFDate::PDFDate((PDFDate *)local_114);
      PDFDate::SetToCurrentTime((PDFDate *)local_114);
      PDFDate::ToString_abi_cxx11_((string *)&left,(PDFDate *)local_114);
      MD5Generator::Accumulate((MD5Generator *)&currentTime.HourFromUTC,(string *)&left);
      std::__cxx11::string::~string((string *)&left);
      MD5Generator::ToStringAsString_abi_cxx11_((MD5Generator *)&currentTime.HourFromUTC);
      puVar4 = (undefined4 *)std::__cxx11::string::c_str();
      uVar1 = puVar4[1];
      uVar2 = puVar4[2];
      uVar3 = puVar4[3];
      *(undefined4 *)this->mIV = *puVar4;
      *(undefined4 *)(this->mIV + 4) = uVar1;
      *(undefined4 *)(this->mIV + 8) = uVar2;
      *(undefined4 *)(this->mIV + 0xc) = uVar3;
      (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                (this->mTargetStream,this->mIV,0x10);
      this->mWroteIV = true;
      PDFDate::~PDFDate((PDFDate *)local_114);
      MD5Generator::~MD5Generator((MD5Generator *)&currentTime.HourFromUTC);
    }
    while (this_local = (OutputAESEncodeStream *)inSize, remainder != 0) {
      if (this->mInIndex + (remainder - (long)this->mIn) < (uchar *)0x10) {
        memcpy(this->mInIndex,inBuffer + (inSize - remainder),remainder);
        this->mInIndex = this->mInIndex + remainder;
        remainder = 0;
      }
      else {
        __n = 0x10 - ((long)this->mInIndex - (long)this->mIn);
        memcpy(this->mInIndex,inBuffer + (inSize - remainder),__n);
        AESencrypt::cbc_encrypt(&this->mEncrypt,this->mIn,this->mOut,0x10,this->mIV);
        (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                  (this->mTargetStream,this->mOut,0x10);
        this->mInIndex = this->mIn;
        remainder = remainder - __n;
      }
    }
  }
  return (LongBufferSizeType)this_local;
}

Assistant:

LongBufferSizeType OutputAESEncodeStream::Write(const IOBasicTypes::Byte* inBuffer, IOBasicTypes::LongBufferSizeType inSize) 
{
	if (!mTargetStream)
		return 0;

	// write IV if didn't write yet
	if (!mWroteIV) {
		// create IV and write it to output file [use existing PDFDate]
		MD5Generator md5;
		// encode current time
		PDFDate currentTime;
		currentTime.SetToCurrentTime();
		md5.Accumulate(currentTime.ToString());
		memcpy(mIV, (const unsigned char*)md5.ToStringAsString().c_str(), AES_BLOCK_SIZE); // md5 should give us the desired 16 bytes

																						   // now write mIV to the output stream
		mTargetStream->Write(mIV, AES_BLOCK_SIZE);
		mWroteIV = true;
	}


	// input and existing buffer sizes smaller than block size, so just copy and return


	IOBasicTypes::LongBufferSizeType left = inSize;

	while (left > 0) {
		// if what's left is not enough to finish block, just copy and stop
		if (left + (mInIndex - mIn) < AES_BLOCK_SIZE) {
			memcpy(mInIndex, inBuffer + inSize - left, left);
			mInIndex += left;
			left = 0;
		}
		else {
			// otherwise, enough to fill block. fill, encode and continue
			IOBasicTypes::LongBufferSizeType remainder = AES_BLOCK_SIZE - (mInIndex - mIn);
			memcpy(mInIndex, inBuffer + inSize - left, remainder);

			// encrypt
			mEncrypt.cbc_encrypt(mIn, mOut, AES_BLOCK_SIZE, mIV);
			mTargetStream->Write(mOut, AES_BLOCK_SIZE);
			mInIndex = mIn;
			left -= remainder;
		}
	}

	return inSize;
}